

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

int rs_read_object_reference
              (FILE *inf,list<ItemThing_*,_std::allocator<ItemThing_*>_> *list,ItemThing **item)

{
  _List_node_base *in_RAX;
  _List_node_base *p_Var1;
  int i;
  int local_c;
  
  if ((read_error == '\0') && ((format_error & 1) == 0)) {
    rs_read_int(inf,&local_c);
    if (player.pack.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&player.pack) {
      in_RAX = (_List_node_base *)0x0;
    }
    else {
      local_c = local_c + 1;
      in_RAX = (_List_node_base *)0x0;
      p_Var1 = player.pack.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      do {
        local_c = local_c + -1;
        if (local_c == 0) {
          in_RAX = p_Var1[1]._M_next;
          break;
        }
        p_Var1 = p_Var1->_M_next;
      } while (p_Var1 != (_List_node_base *)&player.pack);
    }
    (list->super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>)._M_impl._M_node.
    super__List_node_base._M_next = in_RAX;
  }
  return (int)in_RAX;
}

Assistant:

static int rs_read_object_reference(FILE *inf, std::list<ItemThing*>& list, ItemThing **item)
{
    int i;
    
    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf, &i);

    *item = get_list_item(list, i);
            
    return(READSTAT);
}